

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Gl_Window.cxx
# Opt level: O0

int __thiscall Fl_Gl_Window::mode(Fl_Gl_Window *this,int m,int *a)

{
  uint uVar1;
  Fl_Gl_Choice *pFVar2;
  int *piVar3;
  int iVar4;
  Fl_Gl_Choice *pFVar5;
  Fl_Gl_Choice *oldg;
  int *aa;
  int oldmode;
  int *a_local;
  int m_local;
  Fl_Gl_Window *this_local;
  
  if ((m == *(int *)&(this->super_Fl_Window).field_0xec) && (a == this->alist)) {
    this_local._4_4_ = 0;
  }
  else {
    uVar1 = *(uint *)&(this->super_Fl_Window).field_0xec;
    oldg = (Fl_Gl_Choice *)a;
    a_local._4_4_ = m;
    if (a != (int *)0x0) {
      do {
        if (oldg->mode == 0) goto LAB_00220b6b;
        piVar3 = &oldg->mode;
        oldg = (Fl_Gl_Choice *)&oldg->field_0x4;
      } while (*piVar3 != 5);
      a_local._4_4_ = m | 2;
    }
LAB_00220b6b:
    pFVar2 = this->g;
    context(this,(void *)0x0,0);
    *(uint *)&(this->super_Fl_Window).field_0xec = a_local._4_4_;
    this->alist = a;
    iVar4 = Fl_Window::shown(&this->super_Fl_Window);
    if (iVar4 == 0) {
      this->g = (Fl_Gl_Choice *)0x0;
    }
    else {
      pFVar5 = Fl_Gl_Choice::find(a_local._4_4_,a);
      this->g = pFVar5;
      if (((this->g == (Fl_Gl_Choice *)0x0) || (this->g->vis->visualid != pFVar2->vis->visualid)) ||
         (((uVar1 ^ a_local._4_4_) & 2) != 0)) {
        (*(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
        (*(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
      }
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Gl_Window::mode(int m, const int *a) {
  if (m == mode_ && a == alist) return 0;
#ifndef __APPLE__
  int oldmode = mode_;
#endif
#if defined(__APPLE__) || defined(USE_X11)
  if (a) { // when the mode is set using the a array of system-dependent values, and if asking for double buffer,
           // the FL_DOUBLE flag must be set in the mode_ member variable
    const int *aa = a;
    while (*aa) {
      if (*(aa++) ==
#  if defined(__APPLE__)
          kCGLPFADoubleBuffer
#  else
          GLX_DOUBLEBUFFER
#  endif
          ) { m |= FL_DOUBLE; break; }
    }
  }
#endif // !__APPLE__
#if !defined(WIN32) && !defined(__APPLE__)
  Fl_Gl_Choice* oldg = g;
#endif // !WIN32 && !__APPLE__
  context(0);
  mode_ = m; alist = a;
  if (shown()) {
    g = Fl_Gl_Choice::find(m, a);

#if defined(USE_X11)
    // under X, if the visual changes we must make a new X window (yuck!):
    if (!g || g->vis->visualid!=oldg->vis->visualid || (oldmode^m)&FL_DOUBLE) {
      hide();
      show();
    }
#elif defined(WIN32)
    if (!g || (oldmode^m)&(FL_DOUBLE|FL_STEREO)) {
      hide();
      show();
    }
#elif defined(__APPLE_QUARTZ__)
    redraw();
#else
#  error unsupported platform
#endif
  } else {
    g = 0;
  }
  return 1;
}